

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::Variant::reset(Variant *this)

{
  pointer pOVar1;
  Variant *this_local;
  
  if (this->holder != (IVariant *)0x0) {
    pOVar1 = ::std::
             unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
             ::operator->(this->group->pools + this->type);
    (*pOVar1->_vptr_ObjectPoolBase[2])(pOVar1,this->holder);
  }
  this->holder = (IVariant *)0x0;
  this->type = TypeNone;
  return;
}

Assistant:

void reset()
	{
		if (holder)
			group->pools[type]->deallocate_opaque(holder);
		holder = nullptr;
		type = TypeNone;
	}